

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O3

void Acec_ManCollectBoxSets_rec
               (Gia_Man_t *p,int Carry,int iRank,Vec_Int_t *vAdds,Vec_Int_t *vCarryMap,
               Vec_Int_t *vBoxes,Vec_Int_t *vBoxRanks)

{
  uint Entry;
  uint uVar1;
  uint uVar2;
  int iRank_00;
  
  if ((-1 < Carry) && (Carry < vCarryMap->nSize)) {
    Entry = vCarryMap->pArray[(uint)Carry];
    if ((ulong)Entry == 0xffffffff) {
      return;
    }
    if (-1 < (int)Entry) {
      uVar2 = Entry * 6;
      uVar1 = vAdds->nSize;
      if (uVar1 != uVar2 && SBORROW4(uVar1,uVar2) == (int)(uVar1 + Entry * -6) < 0) {
        iRank_00 = iRank + 1;
        Acec_ManCollectBoxSets_rec(p,vAdds->pArray[uVar2],iRank_00,vAdds,vCarryMap,vBoxes,vBoxRanks)
        ;
        if ((int)(uVar2 | 1) < vAdds->nSize) {
          Acec_ManCollectBoxSets_rec
                    (p,vAdds->pArray[uVar2 | 1],iRank_00,vAdds,vCarryMap,vBoxes,vBoxRanks);
          if ((int)(uVar2 + 2) < vAdds->nSize) {
            if (vAdds->pArray[uVar2 + 2] != 0) {
              Acec_ManCollectBoxSets_rec
                        (p,vAdds->pArray[uVar2 + 2],iRank_00,vAdds,vCarryMap,vBoxes,vBoxRanks);
            }
            Vec_IntPush(vBoxes,Entry);
            if ((int)Entry < vBoxRanks->nSize) {
              vBoxRanks->pArray[Entry] = iRank;
              return;
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acec_ManCollectBoxSets_rec( Gia_Man_t * p, int Carry, int iRank, Vec_Int_t * vAdds, Vec_Int_t * vCarryMap, Vec_Int_t * vBoxes, Vec_Int_t * vBoxRanks )
{
    int iBox = Vec_IntEntry( vCarryMap, Carry );
    if ( iBox == -1 )
        return;
    Acec_ManCollectBoxSets_rec( p, Vec_IntEntry(vAdds, 6*iBox+0), iRank+1, vAdds, vCarryMap, vBoxes, vBoxRanks );
    Acec_ManCollectBoxSets_rec( p, Vec_IntEntry(vAdds, 6*iBox+1), iRank+1, vAdds, vCarryMap, vBoxes, vBoxRanks );
    if ( Vec_IntEntry(vAdds, 6*iBox+2) )
        Acec_ManCollectBoxSets_rec( p, Vec_IntEntry(vAdds, 6*iBox+2), iRank+1, vAdds, vCarryMap, vBoxes, vBoxRanks );
    Vec_IntPush( vBoxes, iBox );
    Vec_IntWriteEntry( vBoxRanks, iBox, iRank );
}